

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::FieldDescriptor::CopyTo(FieldDescriptor *this,FieldDescriptorProto *proto)

{
  byte *pbVar1;
  ushort *puVar2;
  char *pcVar3;
  OneofDescriptor *pOVar4;
  FeatureSet *from;
  bool bVar5;
  uint uVar6;
  string *psVar7;
  Descriptor *pDVar8;
  EnumDescriptor *pEVar9;
  FieldOptions *this_00;
  FieldOptions *pFVar10;
  FeatureSet *this_01;
  byte bVar11;
  Arena *pAVar12;
  uint uVar13;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  undefined1 local_50 [48];
  
  puVar2 = (ushort *)(this->all_names_).payload_;
  value._M_len = (ulong)*puVar2;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] =
       (proto->field_0)._impl_._has_bits_.has_bits_[0] | 1;
  value._M_str = (char *)((long)puVar2 + ~value._M_len);
  pAVar12 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar12 & 1) != 0) {
    pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.name_,value,pAVar12);
  (proto->field_0)._impl_.number_ = this->number_;
  uVar13 = *(uint *)&proto->field_0;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] = uVar13 | 0x40;
  bVar11 = this->field_0x1;
  if ((bVar11 & 4) != 0) {
    pcVar3 = (this->all_names_).payload_;
    value_00._M_len = (ulong)*(ushort *)(pcVar3 + 0xe);
    value_00._M_str = pcVar3 + -(ulong)*(ushort *)(pcVar3 + 0xc);
    (proto->field_0)._impl_._has_bits_.has_bits_[0] = uVar13 | 0x50;
    pAVar12 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar12 & 1) != 0) {
      pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.json_name_,value_00,pAVar12);
    bVar11 = this->field_0x1;
  }
  if ((bVar11 & 2) != 0) {
    (proto->field_0)._impl_.proto3_optional_ = true;
    pbVar1 = (byte *)((long)&proto->field_0 + 1);
    *pbVar1 = *pbVar1 | 1;
  }
  if (((this->merged_features_->field_0)._impl_.field_presence_ == 3) &&
     (999 < (int)this->file_->edition_)) {
    uVar13 = 1;
  }
  else {
    uVar13 = (uint)((byte)this->field_0x1 >> 6);
  }
  bVar5 = internal::ValidateEnum(uVar13,(uint32_t *)&FieldDescriptorProto_Label_internal_data_);
  if (!bVar5) {
    __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::FieldDescriptorProto_Label_internal_data_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                  ,0x3a33,
                  "void google::protobuf::FieldDescriptorProto::_internal_set_label(::google::protobuf::FieldDescriptorProto_Label)"
                 );
  }
  (proto->field_0)._impl_.label_ = uVar13;
  pbVar1 = (byte *)((long)&proto->field_0 + 1);
  *pbVar1 = *pbVar1 | 2;
  uVar6 = (uint)this->type_;
  uVar13 = (uint)this->type_;
  if ((uVar13 == 10) && (999 < (int)this->file_->edition_)) {
    uVar6 = 0xb;
    uVar13 = 0xb;
  }
  bVar5 = internal::ValidateEnum(uVar13,(uint32_t *)&FieldDescriptorProto_Type_internal_data_);
  if (!bVar5) {
    __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::FieldDescriptorProto_Type_internal_data_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                  ,0x3a52,
                  "void google::protobuf::FieldDescriptorProto::_internal_set_type(::google::protobuf::FieldDescriptorProto_Type)"
                 );
  }
  (proto->field_0)._impl_.type_ = uVar6;
  uVar13 = *(uint *)&proto->field_0;
  uVar6 = uVar13 | 0x400;
  *(uint *)&proto->field_0 = uVar6;
  if ((this->field_0x1 & 8) != 0) {
    if ((this->containing_type_->field_0x1 & 2) == 0) {
      (proto->field_0)._impl_._has_bits_.has_bits_[0] = uVar13 | 0x402;
      pAVar12 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar12 & 1) != 0) {
        pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
      }
      value_01._M_str = ".";
      value_01._M_len = 1;
      internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.extendee_,value_01,pAVar12);
      uVar6 = (proto->field_0)._impl_._has_bits_.has_bits_[0];
    }
    (proto->field_0)._impl_._has_bits_.has_bits_[0] = uVar6 | 2;
    pAVar12 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar12 & 1) != 0) {
      pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
    }
    psVar7 = internal::ArenaStringPtr::Mutable_abi_cxx11_
                       (&(proto->field_0)._impl_.extendee_,pAVar12);
    local_50._8_8_ = (this->containing_type_->all_names_).payload_;
    local_50._0_8_ = ZEXT28(*(ushort *)(local_50._8_8_ + 2));
    local_50._8_8_ = local_50._8_8_ + ~local_50._0_8_;
    absl::lts_20250127::StrAppend(psVar7,(AlphaNum *)local_50);
  }
  if (*(int *)(kTypeToCppTypeMap + (ulong)this->type_ * 4) == 8) {
    pEVar9 = enum_type(this);
    if ((pEVar9->field_0x1 & 2) == 0) {
      *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 4;
      pAVar12 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar12 & 1) != 0) {
        pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
      }
      value_03._M_str = ".";
      value_03._M_len = 1;
      internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.type_name_,value_03,pAVar12);
    }
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 4;
    pAVar12 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar12 & 1) != 0) {
      pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
    }
    psVar7 = internal::ArenaStringPtr::Mutable_abi_cxx11_
                       (&(proto->field_0)._impl_.type_name_,pAVar12);
    pEVar9 = enum_type(this);
    local_50._8_8_ = (pEVar9->all_names_).payload_;
  }
  else {
    if (*(int *)(kTypeToCppTypeMap + (ulong)this->type_ * 4) != 10) goto LAB_00159b08;
    pDVar8 = message_type(this);
    if ((pDVar8->field_0x1 & 1) != 0) {
      (proto->field_0)._impl_.type_ = 1;
      pbVar1 = (byte *)((long)&proto->field_0 + 1);
      *pbVar1 = *pbVar1 & 0xfb;
    }
    pDVar8 = message_type(this);
    if ((pDVar8->field_0x1 & 2) == 0) {
      *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 4;
      pAVar12 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar12 & 1) != 0) {
        pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
      }
      value_02._M_str = ".";
      value_02._M_len = 1;
      internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.type_name_,value_02,pAVar12);
    }
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 4;
    pAVar12 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar12 & 1) != 0) {
      pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
    }
    psVar7 = internal::ArenaStringPtr::Mutable_abi_cxx11_
                       (&(proto->field_0)._impl_.type_name_,pAVar12);
    pDVar8 = message_type(this);
    local_50._8_8_ = (pDVar8->all_names_).payload_;
  }
  local_50._0_8_ = ZEXT28(*(ushort *)(local_50._8_8_ + 2));
  local_50._8_8_ = local_50._8_8_ + ~local_50._0_8_;
  absl::lts_20250127::StrAppend(psVar7,(AlphaNum *)local_50);
LAB_00159b08:
  bVar11 = this->field_0x1;
  if ((bVar11 & 1) != 0) {
    DefaultValueAsString_abi_cxx11_((string *)local_50,this,false);
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 8;
    pAVar12 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar12 & 1) != 0) {
      pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set
              (&(proto->field_0)._impl_.default_value_,(string *)local_50,pAVar12);
    if ((undefined1 *)local_50._0_8_ != local_50 + 0x10) {
      operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
    }
    bVar11 = this->field_0x1;
  }
  if ((bVar11 & 0x10) != 0) {
    pOVar4 = (this->scope_).containing_oneof;
    if (pOVar4 == (OneofDescriptor *)0x0) {
      internal::protobuf_assumption_failed
                ("res != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb31);
    }
    if ((bVar11 & 8) == 0) {
      (proto->field_0)._impl_.oneof_index_ =
           (int)((ulong)((long)pOVar4 - (long)pOVar4->containing_type_->oneof_decls_) >> 3) *
           -0x49249249;
      *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 0x80;
    }
  }
  pFVar10 = this->options_;
  if (pFVar10 != (FieldOptions *)_FieldOptions_default_instance_) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 0x20;
    this_00 = (proto->field_0)._impl_.options_;
    if (this_00 == (FieldOptions *)0x0) {
      pAVar12 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar12 & 1) != 0) {
        pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
      }
      this_00 = (FieldOptions *)Arena::DefaultConstruct<google::protobuf::FieldOptions>(pAVar12);
      (proto->field_0)._impl_.options_ = this_00;
    }
    FieldOptions::CopyFrom(this_00,pFVar10);
  }
  if ((~this->field_0x3 & 6) != 0) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 0x20;
    pFVar10 = (proto->field_0)._impl_.options_;
    if (pFVar10 == (FieldOptions *)0x0) {
      pAVar12 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar12 & 1) != 0) {
        pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
      }
      pFVar10 = (FieldOptions *)Arena::DefaultConstruct<google::protobuf::FieldOptions>(pAVar12);
      (proto->field_0)._impl_.options_ = pFVar10;
    }
    uVar13 = (byte)this->field_0x3 >> 1 & 3;
    bVar5 = internal::ValidateEnum(uVar13,(uint32_t *)&FieldOptions_CType_internal_data_);
    if (!bVar5) {
      __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::FieldOptions_CType_internal_data_)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                    ,0x4804,
                    "void google::protobuf::FieldOptions::_internal_set_ctype(::google::protobuf::FieldOptions_CType)"
                   );
    }
    (pFVar10->field_0)._impl_.ctype_ = uVar13;
    pbVar1 = (byte *)((long)&pFVar10->field_0 + 0x18);
    *pbVar1 = *pbVar1 | 4;
  }
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 0x20;
    pFVar10 = (proto->field_0)._impl_.options_;
    if (pFVar10 == (FieldOptions *)0x0) {
      pAVar12 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar12 & 1) != 0) {
        pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
      }
      pFVar10 = (FieldOptions *)Arena::DefaultConstruct<google::protobuf::FieldOptions>(pAVar12);
      (proto->field_0)._impl_.options_ = pFVar10;
    }
    pbVar1 = (byte *)((long)&pFVar10->field_0 + 0x18);
    *pbVar1 = *pbVar1 | 1;
    this_01 = (pFVar10->field_0)._impl_.features_;
    if (this_01 == (FeatureSet *)0x0) {
      pAVar12 = (Arena *)(pFVar10->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar12 & 1) != 0) {
        pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
      }
      this_01 = (FeatureSet *)Arena::DefaultConstruct<google::protobuf::FeatureSet>(pAVar12);
      (pFVar10->field_0)._impl_.features_ = this_01;
    }
    FeatureSet::CopyFrom(this_01,from);
  }
  return;
}

Assistant:

void FieldDescriptor::CopyTo(FieldDescriptorProto* proto) const {
  proto->set_name(name());
  proto->set_number(number());
  if (has_json_name_) {
    proto->set_json_name(json_name());
  }
  if (proto3_optional_) {
    proto->set_proto3_optional(true);
  }
  // Some compilers do not allow static_cast directly between two enum types,
  // so we must cast to int first.
  if (is_required() && !IsLegacyEdition(file()->edition())) {
    // Editions files have no required keyword, and we only set this label
    // during descriptor build.
    proto->set_label(static_cast<FieldDescriptorProto::Label>(
        absl::implicit_cast<int>(LABEL_OPTIONAL)));
  } else {
    proto->set_label(static_cast<FieldDescriptorProto::Label>(
        absl::implicit_cast<int>(static_cast<Label>(label_))));
  }
  if (type() == TYPE_GROUP && !IsLegacyEdition(file()->edition())) {
    // Editions files have no group keyword, and we only set this label
    // during descriptor build.
    proto->set_type(static_cast<FieldDescriptorProto::Type>(
        absl::implicit_cast<int>(TYPE_MESSAGE)));
  } else {
    proto->set_type(static_cast<FieldDescriptorProto::Type>(
        absl::implicit_cast<int>(type())));
  }

  if (is_extension()) {
    if (!containing_type()->is_unqualified_placeholder_) {
      proto->set_extendee(".");
    }
    absl::StrAppend(proto->mutable_extendee(), containing_type()->full_name());
  }

  if (cpp_type() == CPPTYPE_MESSAGE) {
    if (message_type()->is_placeholder_) {
      // We don't actually know if the type is a message type.  It could be
      // an enum.
      proto->clear_type();
    }

    if (!message_type()->is_unqualified_placeholder_) {
      proto->set_type_name(".");
    }
    absl::StrAppend(proto->mutable_type_name(), message_type()->full_name());
  } else if (cpp_type() == CPPTYPE_ENUM) {
    if (!enum_type()->is_unqualified_placeholder_) {
      proto->set_type_name(".");
    }
    absl::StrAppend(proto->mutable_type_name(), enum_type()->full_name());
  }

  if (has_default_value()) {
    proto->set_default_value(DefaultValueAsString(false));
  }

  if (containing_oneof() != nullptr && !is_extension()) {
    proto->set_oneof_index(containing_oneof()->index());
  }

  if (&options() != &FieldOptions::default_instance()) {
    *proto->mutable_options() = options();
  }
  if (has_legacy_proto_ctype()) {
    proto->mutable_options()->set_ctype(
        static_cast<FieldOptions::CType>(legacy_proto_ctype()));
  }

  RestoreFeaturesToOptions(proto_features_, proto);
}